

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ground_plane.cpp
# Opt level: O2

ON_2dVector __thiscall ON_GroundPlane::CImpl::TextureSize(CImpl *this)

{
  ON_2dVector local_220;
  ON_2dPoint local_210;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  
  ::ON_XMLVariant::ON_XMLVariant(&local_108,&ON_nil_uuid);
  ON_InternalXMLImpl::GetParameter
            (&local_200,&this->super_ON_InternalXMLImpl,
             L"render-content-manager-document/settings/ground-plane",L"texture-size",&local_108);
  local_210 = ::ON_XMLVariant::As2dPoint(&local_200);
  ON_2dVector::ON_2dVector(&local_220,&local_210);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  return local_220;
}

Assistant:

ON_2dVector TextureSize(void)    const { return ON_2dVector(GetParameter(XMLPath(), ON_RDK_GP_TEXTURE_SIZE, ON_nil_uuid).As2dPoint()); }